

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

FileSystem * __thiscall efsw::FileSystem::getRealPath(FileSystem *this,string *path)

{
  char *__name;
  allocator local_1049;
  string local_1048 [32];
  char local_1028 [8];
  char dir [4096];
  string *path_local;
  string *realPath;
  
  std::__cxx11::string::string((string *)this);
  __name = (char *)std::__cxx11::string::c_str();
  realpath(__name,local_1028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1048,local_1028,&local_1049);
  std::__cxx11::string::operator=((string *)this,local_1048);
  std::__cxx11::string::~string(local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  return this;
}

Assistant:

std::string FileSystem::getRealPath( const std::string& path ) {
	std::string realPath;
#if defined( EFSW_PLATFORM_POSIX )
	char dir[PATH_MAX];
	realpath( path.c_str(), &dir[0] );
	realPath = std::string( dir );
#elif EFSW_OS == EFSW_OS_WIN
	wchar_t dir[_MAX_PATH + 1];
	GetFullPathNameW( String::fromUtf8( path ).toWideString().c_str(), _MAX_PATH, &dir[0],
					  nullptr );
	realPath = String( dir ).toUtf8();
#else
#warning FileSystem::getRealPath() not implemented on this platform.
#endif
	return realPath;
}